

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O1

bool __thiscall Experiments::start(Experiments *this)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  int count;
  int iVar9;
  uint uVar10;
  string res;
  Node node1;
  Node node2;
  ofstream out;
  string local_330;
  vector<Experiments::Node,_std::allocator<Experiments::Node>_> *local_310;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  long local_2e0;
  undefined1 local_2d8 [8];
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  long local_2b0;
  string local_2a8;
  string local_288;
  string local_268;
  vector<Experiments::Node,_std::allocator<Experiments::Node>_> local_248;
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  long local_208;
  ios_base local_138 [264];
  
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
  if (0 < this->size) {
    local_310 = &this->exps;
    lVar8 = 0;
    do {
      iVar2 = this->buf_sizes[lVar8];
      count = iVar2 << 8;
      InitBuffer(this,count);
      iVar9 = count;
      if (0 < iVar2) {
        do {
          rand();
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      lVar6 = std::chrono::_V2::system_clock::now();
      lVar1 = lVar8 + 1;
      uVar10 = (uint)lVar1;
      local_230._0_4_ = uVar10;
      local_228._M_p = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Forward","");
      local_208 = (lVar6 - lVar5) / 1000000;
      std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
                (local_310,(value_type *)local_230);
      uVar3 = local_230._0_4_;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_228._M_p,local_228._M_p + local_220);
      addDataToString(&local_330,uVar3,&local_288,local_208,this->buf_sizes[lVar8]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      lVar6 = std::chrono::_V2::system_clock::now();
      local_300._M_p = (pointer)&local_2f0;
      local_308._0_4_ = uVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Backward","");
      local_2e0 = (lVar6 - lVar5) / 1000000;
      std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
                (local_310,(value_type *)local_308);
      uVar3 = local_308._0_4_;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,local_300._M_p,local_300._M_p + local_2f8);
      addDataToString(&local_330,uVar3,&local_2a8,local_2e0,this->buf_sizes[lVar8]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      Random(this,count);
      lVar6 = std::chrono::_V2::system_clock::now();
      local_2d8._0_4_ = uVar10;
      local_2d0._M_p = (pointer)&local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Random","");
      local_2b0 = (lVar6 - lVar5) / 1000000;
      std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
                (local_310,(value_type *)local_2d8);
      uVar3 = local_2d8._0_4_;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,local_2d0._M_p,local_2d0._M_p + local_2c8);
      addDataToString(&local_330,uVar3,&local_268,local_2b0,this->buf_sizes[lVar8]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != &local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_p != &local_2f0) {
        operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
      }
      lVar8 = lVar1;
    } while (lVar1 < this->size);
  }
  std::ofstream::ofstream(local_230);
  std::ofstream::open(local_230,0x1050ad);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::vector(&local_248,&this->exps)
  ;
  GraphBuild(this,&local_248);
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::~vector(&local_248);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool Experiments::start() {
    string res="";
    for (int i = 0; i < size; i++) {
        int value = KBtoSize(buf_sizes[i]);

        InitBuffer(value);
        Burn(value);

        //прямой
        auto tON = std::chrono::high_resolution_clock::now();
        Forward(value);
        auto tOF = std::chrono::high_resolution_clock::now();
        auto dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node{(unsigned int)i+1, "Forward", dF};
        exps.push_back(node);
        addDataToString(res, node.id, node.name, node.time, buf_sizes[i]);

        //обратный
        tON = std::chrono::high_resolution_clock::now();
        Backward(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node1{(unsigned int)i+1, "Backward", dF};
        exps.push_back(node1);
        addDataToString(res, node1.id, node1.name, node1.time, buf_sizes[i]);

        //случайный
        tON = std::chrono::high_resolution_clock::now();
        Random(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node2{(unsigned int)i+1, "Random", dF};
        exps.push_back(node2);
        addDataToString(res, node2.id, node2.name, node2.time, buf_sizes[i]);
    }
    std::ofstream out;          // поток для записи
    out.open("..\\result\\data.txt"); // окрываем файл для записи
    if (out.is_open())
    {
        out << res << endl;
    }
    GraphBuild(exps);
    return true;
}